

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::CheckAllocExternalMark(Recycler *this)

{
  CollectionState CVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  ThreadContextId pvVar5;
  undefined8 *in_FS_OFFSET;
  
  if (this->disableThreadAccessCheck == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x82c,"(!disableThreadAccessCheck)","!disableThreadAccessCheck");
    if (!bVar4) goto LAB_0026a21b;
    *puVar2 = 0;
  }
  pvVar5 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar5 != this->mainThreadId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x82d,"(GetCurrentThreadContextId() == mainThreadId)",
                       "GetCurrentThreadContextId() == mainThreadId");
    if (!bVar4) goto LAB_0026a21b;
    *puVar2 = 0;
  }
  CVar1 = (this->collectionState).value;
  if ((CVar1 != CollectionStateConcurrentMark & (byte)CVar1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x832,
                       "(this->IsMarkState() && collectionState != CollectionStateConcurrentMark)",
                       "this->IsMarkState() && collectionState != CollectionStateConcurrentMark");
    if (!bVar4) {
LAB_0026a21b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void
Recycler::CheckAllocExternalMark() const
{
    Assert(!disableThreadAccessCheck);
    Assert(GetCurrentThreadContextId() == mainThreadId);
#if ENABLE_CONCURRENT_GC
  #ifdef HEAP_ENUMERATION_VALIDATION
    Assert((this->IsMarkState() || this->IsPostEnumHeapValidationInProgress()) && collectionState != CollectionStateConcurrentMark);
  #else
    Assert(this->IsMarkState()  && collectionState != CollectionStateConcurrentMark);
  #endif
#else
    Assert(this->IsMarkState());
#endif
}